

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtContinuousConvexCollision.cpp
# Opt level: O2

void __thiscall
cbtContinuousConvexCollision::computeClosestPoints
          (cbtContinuousConvexCollision *this,cbtTransform *transA,cbtTransform *transB,
          cbtPointCollector *pointCollector)

{
  cbtVector3 *v;
  int shapeTypeA;
  int shapeTypeB;
  cbtConvexShape *pcVar1;
  cbtConvexShape *objectB;
  cbtStaticPlaneShape *pcVar2;
  undefined1 auVar3 [16];
  cbtScalar in_XMM0_Da;
  cbtScalar marginB;
  cbtScalar acVar4 [4];
  undefined1 auVar12 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar5 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  ulong uVar19;
  undefined1 auVar20 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  cbtVector3 cVar21;
  cbtScalar distance;
  cbtVector3 vtxInPlaneWorld;
  cbtVector3 normalOnSurfaceB;
  cbtVector3 vtxInPlaneProjected;
  cbtVector3 vtx;
  cbtTransform planeInConvex;
  cbtGjkPairDetector gjk;
  ClosestPointInput input;
  float local_21c;
  undefined1 local_218 [16];
  cbtVector3 local_208;
  undefined1 local_1f8 [16];
  cbtTransform local_1e8;
  cbtTransform local_1a8;
  undefined1 local_168 [32];
  cbtVoronoiSimplexSolver *pcStack_148;
  cbtConvexShape *pcStack_140;
  cbtConvexShape *pcStack_138;
  cbtScalar acStack_130 [2];
  cbtGjkPairDetector local_128;
  ClosestPointInput local_b8;
  
  if (this->m_convexB1 == (cbtConvexShape *)0x0) {
    local_b8.m_transformA.m_basis.m_el[0].m_floats._0_8_ =
         *(undefined8 *)(transA->m_basis).m_el[0].m_floats;
    local_b8.m_transformA.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)((transA->m_basis).m_el[0].m_floats + 2);
    pcVar1 = this->m_convexA;
    pcVar2 = this->m_planeShape;
    v = &pcVar2->m_planeNormal;
    local_b8.m_transformA.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(transA->m_basis).m_el[1].m_floats;
    local_b8.m_transformA.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((transA->m_basis).m_el[1].m_floats + 2);
    local_b8.m_transformA.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(transA->m_basis).m_el[2].m_floats;
    local_b8.m_transformA.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((transA->m_basis).m_el[2].m_floats + 2);
    local_b8.m_transformA.m_origin.m_floats._0_8_ = *(undefined8 *)(transA->m_origin).m_floats;
    local_b8.m_transformA.m_origin.m_floats._8_8_ = *(undefined8 *)((transA->m_origin).m_floats + 2)
    ;
    cbtTransform::inverse(&local_1a8,transB);
    cbtTransform::operator*((cbtTransform *)local_168,&local_1a8,&local_b8.m_transformA);
    local_128.super_cbtDiscreteCollisionDetectorInterface.
    _vptr_cbtDiscreteCollisionDetectorInterface = (_func_int **)local_168._0_8_;
    local_128.m_cachedSeparatingAxis.m_floats[0] = (cbtScalar)local_168._8_4_;
    local_128.m_cachedSeparatingAxis.m_floats[1] = (cbtScalar)local_168._12_4_;
    local_128.m_cachedSeparatingAxis.m_floats[2] = (cbtScalar)local_168._16_4_;
    local_128.m_cachedSeparatingAxis.m_floats[3] = (cbtScalar)local_168._20_4_;
    local_128.m_penetrationDepthSolver = (cbtConvexPenetrationDepthSolver *)local_168._24_8_;
    local_128.m_simplexSolver = pcStack_148;
    local_128.m_minkowskiA = pcStack_140;
    local_128.m_minkowskiB = pcStack_138;
    local_128.m_shapeTypeA = (int)acStack_130[0];
    local_128.m_shapeTypeB = (int)acStack_130[1];
    uVar19 = 0;
    cbtTransform::inverse(&local_1e8,&local_b8.m_transformA);
    cbtTransform::operator*(&local_1a8,&local_1e8,transB);
    local_168._0_4_ = local_1a8.m_basis.m_el[0].m_floats[0];
    local_168._4_4_ = local_1a8.m_basis.m_el[0].m_floats[1];
    local_168._8_4_ = local_1a8.m_basis.m_el[0].m_floats[2];
    local_168._12_4_ = local_1a8.m_basis.m_el[0].m_floats[3];
    local_168._16_4_ = local_1a8.m_basis.m_el[1].m_floats[0];
    local_168._20_4_ = local_1a8.m_basis.m_el[1].m_floats[1];
    local_168._24_4_ = local_1a8.m_basis.m_el[1].m_floats[2];
    local_168._28_4_ = local_1a8.m_basis.m_el[1].m_floats[3];
    pcStack_148 = (cbtVoronoiSimplexSolver *)local_1a8.m_basis.m_el[2].m_floats._0_8_;
    pcStack_140 = (cbtConvexShape *)local_1a8.m_basis.m_el[2].m_floats._8_8_;
    pcStack_138 = (cbtConvexShape *)local_1a8.m_origin.m_floats._0_8_;
    acStack_130[0] = local_1a8.m_origin.m_floats[2];
    acStack_130[1] = local_1a8.m_origin.m_floats[3];
    auVar12 = ZEXT856((ulong)local_1a8.m_basis.m_el[0].m_floats._8_8_);
    auVar20 = ZEXT856(uVar19);
    cVar21 = ::operator-(v);
    auVar13._0_8_ = cVar21.m_floats._8_8_;
    auVar13._8_56_ = auVar20;
    auVar6._0_8_ = cVar21.m_floats._0_8_;
    auVar6._8_56_ = auVar12;
    local_208.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar6._0_16_,auVar13._0_16_);
    auVar12 = ZEXT856(local_208.m_floats._8_8_);
    cVar21 = ::operator*((cbtMatrix3x3 *)local_168,&local_208);
    auVar14._0_8_ = cVar21.m_floats._8_8_;
    auVar14._8_56_ = auVar20;
    auVar7._0_8_ = cVar21.m_floats._0_8_;
    auVar7._8_56_ = auVar12;
    acVar4 = (cbtScalar  [4])vmovlhps_avx(auVar7._0_16_,auVar14._0_16_);
    local_1e8.m_basis.m_el[0].m_floats = acVar4;
    (*(pcVar1->super_cbtCollisionShape)._vptr_cbtCollisionShape[0x10])(pcVar1,&local_1e8);
    auVar20 = auVar14._8_56_;
    local_1a8.m_basis.m_el[0].m_floats = (cbtScalar  [4])vmovlhps_avx(acVar4,auVar14._0_16_);
    auVar12 = ZEXT856(local_1a8.m_basis.m_el[0].m_floats._8_8_);
    cVar21 = cbtTransform::operator()((cbtTransform *)&local_128,(cbtVector3 *)&local_1a8);
    auVar15._0_8_ = cVar21.m_floats._8_8_;
    auVar15._8_56_ = auVar20;
    auVar8._0_8_ = cVar21.m_floats._0_8_;
    auVar8._8_56_ = auVar12;
    auVar5 = auVar8._0_16_;
    auVar3 = vmovshdup_avx(auVar5);
    local_218 = auVar15._0_16_;
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ * (pcVar2->m_planeNormal).m_floats[1])),
                             auVar5,ZEXT416((uint)(pcVar2->m_planeNormal).m_floats[0]));
    auVar3 = vfmadd231ss_fma(auVar3,local_218,ZEXT416((uint)(pcVar2->m_planeNormal).m_floats[2]));
    local_21c = auVar3._0_4_ - pcVar2->m_planeConstant;
    auVar12 = (undefined1  [56])0x0;
    cVar21 = ::operator*(v,&local_21c);
    auVar16._0_8_ = cVar21.m_floats._8_8_;
    auVar16._8_56_ = auVar20;
    auVar9._0_8_ = cVar21.m_floats._0_8_;
    auVar9._8_56_ = auVar12;
    auVar3 = vsubps_avx(auVar5,auVar9._0_16_);
    auVar5 = vsubps_avx(local_218,auVar16._0_16_);
    auVar20 = ZEXT856(auVar5._8_8_);
    local_1e8.m_basis.m_el[0].m_floats = (cbtScalar  [4])vinsertps_avx(auVar3,auVar5,0x28);
    auVar12 = ZEXT856(local_1e8.m_basis.m_el[0].m_floats._8_8_);
    cVar21 = cbtTransform::operator()(transB,(cbtVector3 *)&local_1e8);
    auVar17._0_8_ = cVar21.m_floats._8_8_;
    auVar17._8_56_ = auVar20;
    auVar10._0_8_ = cVar21.m_floats._0_8_;
    auVar10._8_56_ = auVar12;
    local_208.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar10._0_16_,auVar17._0_16_);
    auVar12 = ZEXT856(local_208.m_floats._8_8_);
    cVar21 = ::operator*(&transB->m_basis,v);
    auVar18._0_8_ = cVar21.m_floats._8_8_;
    auVar18._8_56_ = auVar20;
    auVar11._0_8_ = cVar21.m_floats._0_8_;
    auVar11._8_56_ = auVar12;
    local_1f8 = vmovlhps_avx(auVar11._0_16_,auVar18._0_16_);
    (*(pointCollector->super_Result)._vptr_Result[4])
              ((ulong)(uint)local_21c,pointCollector,local_1f8,&local_208);
  }
  else {
    cbtVoronoiSimplexSolver::reset(this->m_simplexSolver);
    pcVar1 = this->m_convexA;
    objectB = this->m_convexB1;
    shapeTypeA = (pcVar1->super_cbtCollisionShape).m_shapeType;
    shapeTypeB = (objectB->super_cbtCollisionShape).m_shapeType;
    (*(pcVar1->super_cbtCollisionShape)._vptr_cbtCollisionShape[0xc])(pcVar1);
    marginB = in_XMM0_Da;
    (*(this->m_convexB1->super_cbtCollisionShape)._vptr_cbtCollisionShape[0xc])();
    cbtGjkPairDetector::cbtGjkPairDetector
              (&local_128,pcVar1,objectB,shapeTypeA,shapeTypeB,in_XMM0_Da,marginB,
               this->m_simplexSolver,this->m_penetrationDepthSolver);
    local_b8.m_maximumDistanceSquared = 1e+18;
    local_b8.m_transformA.m_basis.m_el[0].m_floats._0_8_ =
         *(undefined8 *)(transA->m_basis).m_el[0].m_floats;
    local_b8.m_transformA.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)((transA->m_basis).m_el[0].m_floats + 2);
    local_b8.m_transformA.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(transA->m_basis).m_el[1].m_floats;
    local_b8.m_transformA.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((transA->m_basis).m_el[1].m_floats + 2);
    local_b8.m_transformA.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(transA->m_basis).m_el[2].m_floats;
    local_b8.m_transformA.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((transA->m_basis).m_el[2].m_floats + 2);
    local_b8.m_transformA.m_origin.m_floats._0_8_ = *(undefined8 *)(transA->m_origin).m_floats;
    local_b8.m_transformA.m_origin.m_floats._8_8_ = *(undefined8 *)((transA->m_origin).m_floats + 2)
    ;
    local_b8.m_transformB.m_basis.m_el[0].m_floats._0_8_ =
         *(undefined8 *)(transB->m_basis).m_el[0].m_floats;
    local_b8.m_transformB.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)((transB->m_basis).m_el[0].m_floats + 2);
    local_b8.m_transformB.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(transB->m_basis).m_el[1].m_floats;
    local_b8.m_transformB.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((transB->m_basis).m_el[1].m_floats + 2);
    local_b8.m_transformB.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(transB->m_basis).m_el[2].m_floats;
    local_b8.m_transformB.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((transB->m_basis).m_el[2].m_floats + 2);
    local_b8.m_transformB.m_origin.m_floats._0_8_ = *(undefined8 *)(transB->m_origin).m_floats;
    local_b8.m_transformB.m_origin.m_floats._8_8_ = *(undefined8 *)((transB->m_origin).m_floats + 2)
    ;
    cbtGjkPairDetector::getClosestPoints
              (&local_128,&local_b8,&pointCollector->super_Result,(cbtIDebugDraw *)0x0,false);
  }
  return;
}

Assistant:

void cbtContinuousConvexCollision::computeClosestPoints(const cbtTransform& transA, const cbtTransform& transB, cbtPointCollector& pointCollector)
{
	if (m_convexB1)
	{
		m_simplexSolver->reset();
		cbtGjkPairDetector gjk(m_convexA, m_convexB1, m_convexA->getShapeType(), m_convexB1->getShapeType(), m_convexA->getMargin(), m_convexB1->getMargin(), m_simplexSolver, m_penetrationDepthSolver);
		cbtGjkPairDetector::ClosestPointInput input;
		input.m_transformA = transA;
		input.m_transformB = transB;
		gjk.getClosestPoints(input, pointCollector, 0);
	}
	else
	{
		//convex versus plane
		const cbtConvexShape* convexShape = m_convexA;
		const cbtStaticPlaneShape* planeShape = m_planeShape;

		const cbtVector3& planeNormal = planeShape->getPlaneNormal();
		const cbtScalar& planeConstant = planeShape->getPlaneConstant();

		cbtTransform convexWorldTransform = transA;
		cbtTransform convexInPlaneTrans;
		convexInPlaneTrans = transB.inverse() * convexWorldTransform;
		cbtTransform planeInConvex;
		planeInConvex = convexWorldTransform.inverse() * transB;

		cbtVector3 vtx = convexShape->localGetSupportingVertex(planeInConvex.getBasis() * -planeNormal);

		cbtVector3 vtxInPlane = convexInPlaneTrans(vtx);
		cbtScalar distance = (planeNormal.dot(vtxInPlane) - planeConstant);

		cbtVector3 vtxInPlaneProjected = vtxInPlane - distance * planeNormal;
		cbtVector3 vtxInPlaneWorld = transB * vtxInPlaneProjected;
		cbtVector3 normalOnSurfaceB = transB.getBasis() * planeNormal;

		pointCollector.addContactPoint(
			normalOnSurfaceB,
			vtxInPlaneWorld,
			distance);
	}
}